

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O1

PropResult __thiscall
Clasp::DomainHeuristic::propagate(DomainHeuristic *this,Solver *s,Literal param_2,uint32 *aId)

{
  DomAction *a;
  uint16 *gPrio;
  uint32 dl;
  pointer pDVar1;
  pointer pFVar2;
  PropResult PVar3;
  ulong uVar4;
  uint uVar5;
  uint32 uVar6;
  Frame local_48;
  Constraint *local_40;
  FrameVec *local_38;
  
  dl = (s->levels_).super_type.ebo_.size;
  local_38 = &this->frames_;
  local_40 = &this->super_Constraint;
  uVar6 = *aId;
  do {
    pDVar1 = (this->actions_).ebo_.buf;
    uVar4 = *(ulong *)(pDVar1 + uVar6);
    if ((*(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uint)((int)uVar4 * 4)) & 3) == 0) {
      a = pDVar1 + uVar6;
      gPrio = (this->prios_).ebo_.buf
              [(ulong)*(uint *)&(this->super_ClaspVsids_t<Clasp::DomScore>).score_.ebo_.buf
                                [uVar4 & 0x3fffffff].field_0xc & 0x3fffffff].prio +
              (uVar4 >> 0x1e & 3);
      if (*gPrio <= a->prio) {
        applyAction(this,s,a,gPrio);
        if (dl != (this->frames_).ebo_.buf[(this->frames_).ebo_.size - 1].dl) {
          Solver::addUndoWatch(s,dl,local_40);
          local_48.head = 0x7fffffff;
          local_48.dl = dl;
          bk_lib::
          pod_vector<Clasp::DomainHeuristic::Frame,_std::allocator<Clasp::DomainHeuristic::Frame>_>
          ::push_back(local_38,&local_48);
        }
        pDVar1 = (this->actions_).ebo_.buf;
        pFVar2 = (this->frames_).ebo_.buf;
        uVar5 = (this->frames_).ebo_.size - 1;
        *(ulong *)(pDVar1 + uVar6) =
             *(ulong *)(pDVar1 + uVar6) & 0x80000000ffffffff |
             (ulong)(pFVar2[uVar5].head & 0x7fffffff) << 0x20;
        pFVar2[uVar5].head = uVar6;
      }
    }
    uVar4 = (ulong)uVar6;
    uVar6 = uVar6 + 1;
  } while (*(long *)((this->actions_).ebo_.buf + uVar4) < 0);
  PVar3.ok = true;
  PVar3.keepWatch = true;
  return PVar3;
}

Assistant:

Constraint::PropResult DomainHeuristic::propagate(Solver& s, Literal, uint32& aId) {
	uint32 n = aId;
	uint32 D = s.decisionLevel();
	do {
		DomAction& a = actions_[n];
		uint16& prio = this->prio(a.var, a.mod);
		if (s.value(a.var) == value_free && a.prio >= prio) {
			applyAction(s, a, prio);
			if (D != frames_.back().dl) {
				s.addUndoWatch(D, this);
				frames_.push_back(Frame(D, DomAction::UNDO_NIL));
			}
			pushUndo(frames_.back().head, n);
		}
	} while (actions_[n++].next);
	return PropResult(true, true);
}